

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O0

bool __thiscall DiskTableNode::hasKey(DiskTableNode *this,longlong key)

{
  bool bVar1;
  bool local_31;
  _Self local_30;
  _Self local_28;
  IndexMap *local_20;
  IndexMap *i;
  longlong key_local;
  DiskTableNode *this_local;
  
  i = (IndexMap *)key;
  key_local = (longlong)this;
  local_20 = getIndex(this);
  bVar1 = mightIn(this,(longlong)i);
  local_31 = false;
  if (bVar1) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<long_long,_unsigned_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_long>_>_>
         ::find(this->index,(key_type *)&i);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<long_long,_unsigned_long,_std::less<long_long>,_std::allocator<std::pair<const_long_long,_unsigned_long>_>_>
         ::end(local_20);
    local_31 = std::operator!=(&local_28,&local_30);
  }
  return local_31;
}

Assistant:

bool DiskTableNode::hasKey(long long key) {
    auto *i = getIndex();
    return mightIn(key) && index->find(key) != i->end();
}